

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateString(char *string)

{
  uchar *puVar1;
  cJSON *item;
  char *string_local;
  
  string_local = (char *)cJSON_New_Item(&global_hooks);
  if ((cJSON *)string_local != (cJSON *)0x0) {
    ((cJSON *)string_local)->type = 0x10;
    puVar1 = cJSON_strdup((uchar *)string,&global_hooks);
    ((cJSON *)string_local)->valuestring = (char *)puVar1;
    if (((cJSON *)string_local)->valuestring == (char *)0x0) {
      cJSON_Delete((cJSON *)string_local);
      string_local = (char *)0x0;
    }
  }
  return (cJSON *)string_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateString(const char *string)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_String;
        item->valuestring = (char*)cJSON_strdup((const unsigned char*)string, &global_hooks);
        if(!item->valuestring)
        {
            cJSON_Delete(item);
            return NULL;
        }
    }

    return item;
}